

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.cc
# Opt level: O0

bool PrintFileSum(EVP_MD *md,Source *source)

{
  bool bVar1;
  undefined8 uVar2;
  char *local_70;
  undefined1 local_40 [8];
  string hex_digest;
  Source *source_local;
  EVP_MD *md_local;
  
  hex_digest.field_2._8_8_ = source;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = SumFile((string *)local_40,md,(Source *)hex_digest.field_2._8_8_);
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    bVar1 = Source::is_stdin((Source *)hex_digest.field_2._8_8_);
    if (bVar1) {
      local_70 = "-";
    }
    else {
      Source::filename_abi_cxx11_((Source *)hex_digest.field_2._8_8_);
      local_70 = (char *)std::__cxx11::string::c_str();
    }
    printf("%s  %s\n",uVar2,local_70);
    md_local._7_1_ = true;
  }
  else {
    md_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_40);
  return md_local._7_1_;
}

Assistant:

static bool PrintFileSum(const EVP_MD *md, const Source &source) {
  std::string hex_digest;
  if (!SumFile(&hex_digest, md, source)) {
    return false;
  }

  // TODO: When given "--binary" or "-b", we should print " *" instead of "  "
  // between the digest and the filename.
  //
  // MSYS and Cygwin md5sum default to binary mode by default, whereas other
  // platforms' tools default to text mode by default. We default to text mode
  // by default and consider text mode equivalent to binary mode (i.e. we
  // always use Unix semantics, even on Windows), which means that our default
  // output will differ from the MSYS and Cygwin tools' default output.
  printf("%s  %s\n", hex_digest.c_str(),
         source.is_stdin() ? "-" : source.filename().c_str());
  return true;
}